

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O2

string * __thiscall
MinVR::VRDataIndex::addData<int>
          (string *__return_storage_ptr__,VRDataIndex *this,string *key,string *nameSpace,int value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string local_48;
  
  if (*(key->_M_dataplus)._M_p == '/') {
    addData(__return_storage_ptr__,this,key,value);
  }
  else {
    validateNameSpace(&local_48,this,nameSpace);
    std::operator+(&bStack_68,&local_48,key);
    addData(__return_storage_ptr__,this,&bStack_68,value);
    std::__cxx11::string::~string((string *)&bStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string addData(const std::string &key,
                      const std::string nameSpace, T value) {

    // If the name provided is an absolute name, ignore the nameSpace.
    if (key[0] == '/') {

      return addData(key, value);
    } else {

      return addData(validateNameSpace(nameSpace) + key, value);
    }
  }